

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall
luna::Exception::SetWhat<char_const*,char_const(&)[8]>
          (Exception *this,ostringstream *oss,char **arg,char (*args) [8])

{
  char *__s;
  size_t sVar1;
  
  __s = *arg;
  if (__s == (char *)0x0) {
    std::ios::clear((int)oss + (int)*(undefined8 *)(*(long *)oss + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,__s,sVar1);
  }
  sVar1 = strlen(*args);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,*args,sVar1);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }